

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O0

vector<long,_std::allocator<long>_> *
CoreML::defaultSizeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ImageFeatureType *params)

{
  SizeFlexibilityCase SVar1;
  int64 iVar2;
  ImageFeatureType_EnumeratedImageSizes *pIVar3;
  ImageFeatureType_ImageSize *pIVar4;
  ImageFeatureType_ImageSizeRange *pIVar5;
  SizeRange *pSVar6;
  uint64 local_68;
  uint64 local_60;
  uint64 local_58;
  uint64 local_50 [2];
  int64 local_40;
  int64 local_38 [3];
  undefined1 local_19;
  ImageFeatureType *local_18;
  ImageFeatureType *params_local;
  vector<long,_std::allocator<long>_> *defaultSize;
  
  local_19 = 0;
  local_18 = params;
  params_local = (ImageFeatureType *)__return_storage_ptr__;
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  iVar2 = Specification::ImageFeatureType::width(local_18);
  if ((iVar2 < 1) || (iVar2 = Specification::ImageFeatureType::height(local_18), iVar2 < 1)) {
    SVar1 = Specification::ImageFeatureType::SizeFlexibility_case(local_18);
    if (SVar1 != SIZEFLEXIBILITY_NOT_SET) {
      if (SVar1 == kEnumeratedSizes) {
        pIVar3 = Specification::ImageFeatureType::enumeratedsizes(local_18);
        pIVar4 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar3,0);
        local_50[0] = Specification::ImageFeatureType_ImageSize::width(pIVar4);
        std::vector<long,_std::allocator<long>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)local_50);
        pIVar3 = Specification::ImageFeatureType::enumeratedsizes(local_18);
        pIVar4 = Specification::ImageFeatureType_EnumeratedImageSizes::sizes(pIVar3,0);
        local_58 = Specification::ImageFeatureType_ImageSize::height(pIVar4);
        std::vector<long,_std::allocator<long>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)&local_58);
      }
      else if (SVar1 == kImageSizeRange) {
        pIVar5 = Specification::ImageFeatureType::imagesizerange(local_18);
        pSVar6 = Specification::ImageFeatureType_ImageSizeRange::widthrange(pIVar5);
        local_60 = Specification::SizeRange::lowerbound(pSVar6);
        std::vector<long,_std::allocator<long>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)&local_60);
        pIVar5 = Specification::ImageFeatureType::imagesizerange(local_18);
        pSVar6 = Specification::ImageFeatureType_ImageSizeRange::heightrange(pIVar5);
        local_68 = Specification::SizeRange::lowerbound(pSVar6);
        std::vector<long,_std::allocator<long>_>::push_back
                  (__return_storage_ptr__,(value_type_conflict2 *)&local_68);
      }
    }
  }
  else {
    local_38[0] = Specification::ImageFeatureType::width(local_18);
    std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,local_38);
    local_40 = Specification::ImageFeatureType::height(local_18);
    std::vector<long,_std::allocator<long>_>::push_back(__return_storage_ptr__,&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultSizeOf(const Specification::ImageFeatureType &params) {
        std::vector<int64_t> defaultSize;

        if (params.width() > 0 && params.height() > 0) {
            defaultSize.push_back((int64_t)params.width());
            defaultSize.push_back((int64_t)params.height());
            return defaultSize;
        }

        switch (params.SizeFlexibility_case()) {
            case Specification::ImageFeatureType::kEnumeratedSizes:
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).width());
                defaultSize.push_back((int64_t)params.enumeratedsizes().sizes(0).height());
                break;
            case Specification::ImageFeatureType::kImageSizeRange:
                defaultSize.push_back((int64_t)params.imagesizerange().widthrange().lowerbound());
                defaultSize.push_back((int64_t)params.imagesizerange().heightrange().lowerbound());
                break;
            case Specification::ImageFeatureType::SIZEFLEXIBILITY_NOT_SET:
                break;
        }
        return defaultSize;
    }